

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

SeatPromptResult *
filexfer_get_userpass_input(SeatPromptResult *__return_storage_ptr__,Seat *seat,prompts_t *p)

{
  SeatPromptResult local_38;
  
  cmdline_get_passwd_input
            (__return_storage_ptr__,p,&filexfer_get_userpass_input::cmdline_state,false);
  if (__return_storage_ptr__->kind == SPRK_INCOMPLETE) {
    console_get_userpass_input(&local_38,p);
    __return_storage_ptr__->errdata_lit = local_38.errdata_lit;
    __return_storage_ptr__->errdata_u = local_38.errdata_u;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_38._28_4_;
    __return_storage_ptr__->kind = local_38.kind;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_38._4_4_;
    __return_storage_ptr__->errfn = local_38.errfn;
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult filexfer_get_userpass_input(Seat *seat, prompts_t *p)
{
    /* The file transfer tools don't support Restart Session, so we
     * can just have a single static cmdline_get_passwd_input_state
     * that's never reset */
    static cmdline_get_passwd_input_state cmdline_state =
        CMDLINE_GET_PASSWD_INPUT_STATE_INIT;

    SeatPromptResult spr;
    spr = cmdline_get_passwd_input(p, &cmdline_state, false);
    if (spr.kind == SPRK_INCOMPLETE)
        spr = console_get_userpass_input(p);
    return spr;
}